

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackNN.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  uint vec_len;
  uint vec_len_00;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  long *plVar6;
  NaDataFile *df;
  NaDataFile *df_00;
  double *pdVar7;
  void *pvVar8;
  NaReal *vec;
  NaReal *vec_00;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  undefined8 uVar13;
  NaNNUnit nnu;
  NaStdBackProp bpe;
  NaNNUnit local_d40 [1520];
  NaStdBackProp local_750 [1824];
  
  if (argc == 6) {
    NaOpenLogFile("BackNN.log");
    signal(2,handle_sigint);
    NaNNUnit::NaNNUnit(local_d40);
    NaNNUnit::Load((char *)local_d40);
    vec_len = NaUnit::InputDim();
    vec_len_00 = NaUnit::OutputDim();
    plVar5 = (long *)OpenInputDataFile(argv[2]);
    plVar6 = (long *)OpenInputDataFile(argv[3]);
    df = (NaDataFile *)OpenOutputDataFile(argv[4],bdtAuto,vec_len_00);
    df_00 = (NaDataFile *)OpenOutputDataFile(argv[5],bdtAuto,vec_len);
    NaStdBackProp::NaStdBackProp(local_750,local_d40);
    uVar10 = (ulong)vec_len;
    pdVar7 = (double *)operator_new__(uVar10 * 8);
    uVar11 = (ulong)vec_len_00 * 8;
    pvVar8 = operator_new__(uVar11);
    vec = (NaReal *)operator_new__(uVar11);
    vec_00 = (NaReal *)operator_new__(uVar10 * 8);
    cVar2 = (**(code **)(*plVar5 + 0x28))(plVar5);
    if (cVar2 != '\0') {
      cVar2 = (**(code **)(*plVar6 + 0x28))(plVar6);
      if (cVar2 != '\0') {
        do {
          if (vec_len != 0) {
            uVar11 = 0;
            do {
              dVar12 = (double)(**(code **)(*plVar5 + 0x18))(plVar5);
              pdVar7[uVar11] = dVar12;
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
          }
          if (vec_len_00 != 0) {
            uVar11 = 0;
            do {
              uVar13 = (**(code **)(*plVar6 + 0x18))(plVar6);
              *(undefined8 *)((long)pvVar8 + uVar11 * 8) = uVar13;
              uVar11 = uVar11 + 1;
            } while (vec_len_00 != uVar11);
          }
          if (vec_len != 0) {
            memset(vec_00,0,uVar10 * 8);
          }
          NaNNUnit::Function((double *)local_d40,pdVar7);
          uVar3 = NaNNUnit::OutputLayer();
          if (-1 < (int)uVar3) {
            do {
              uVar4 = NaNNUnit::OutputLayer();
              if (uVar3 == uVar4) {
                NaStdBackProp::DeltaRule((double *)local_750,SUB81(pvVar8,0));
              }
              else {
                NaStdBackProp::DeltaRule((uint)local_750,uVar3);
              }
              bVar1 = 0 < (int)uVar3;
              uVar3 = uVar3 - 1;
            } while (bVar1);
          }
          if (vec_len != 0) {
            uVar11 = 0;
            do {
              dVar12 = (double)NaStdBackProp::PartOfDeltaRule((uint)local_750,0);
              vec_00[uVar11] = vec_00[uVar11] - dVar12;
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
          }
          write_output(df,vec_len_00,vec);
          write_output(df_00,vec_len,vec_00);
          printf("%d records done\r");
          if (bTerminate != false) break;
          cVar2 = (**(code **)(*plVar5 + 0x20))(plVar5);
          if (cVar2 == '\0') break;
          cVar2 = (**(code **)(*plVar6 + 0x20))(plVar6);
        } while (cVar2 != '\0');
      }
    }
    putchar(10);
    if (df_00 != (NaDataFile *)0x0) {
      (**(code **)(*(long *)df_00 + 8))();
    }
    if (df != (NaDataFile *)0x0) {
      (**(code **)(*(long *)df + 8))();
    }
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 8))(plVar6);
    }
    (**(code **)(*plVar5 + 8))(plVar5);
    NaStdBackProp::~NaStdBackProp(local_750);
    NaNNUnit::~NaNNUnit(local_d40);
    iVar9 = 0;
  }
  else {
    printf("Usage: %s NN-file DataIn DesiredOut DataOut ErrOnIn\n where NN-file    - evaluated neural network (not changed)\n       DataIn     - network input (=input dimension)\n       DesiredOut - target output (=output dimension)\n       DataOut    - output produced by the network\n       ErrOnIn    - error on input produced by the network\n"
           ,*argv);
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

int main (int argc, char* argv[])
{
  if(argc != 6)
    {
      printf("Usage: %s NN-file DataIn DesiredOut DataOut ErrOnIn\n"\
	     " where NN-file    - evaluated neural network (not changed)\n"\
	     "       DataIn     - network input (=input dimension)\n"\
	     "       DesiredOut - target output (=output dimension)\n"\
	     "       DataOut    - output produced by the network\n"\
	     "       ErrOnIn    - error on input produced by the network\n",
	     argv[0]);
      return 1;
    }

  NaOpenLogFile("BackNN.log");

  /* Let's handle SIGINT(2) */
  signal(SIGINT, handle_sigint);

  try{
    NaNNUnit            nnu;
    nnu.Load(argv[1]);

    unsigned	nInpDim = nnu.InputDim();
    unsigned	nOutDim = nnu.OutputDim();

    NaDataFile	*dfDataIn = OpenInputDataFile(argv[2]);
    NaDataFile	*dfTargetOut = OpenInputDataFile(argv[3]);
    NaDataFile	*dfDataOut = OpenOutputDataFile(argv[4], bdtAuto, nOutDim);
    NaDataFile	*dfErrOnIn = OpenOutputDataFile(argv[5], bdtAuto, nInpDim);

    NaStdBackProp	bpe(nnu);

    /* Prepare buffers for input, target and output data */
    NaReal	*pIn = new NaReal[nInpDim];
    NaReal	*pTar = new NaReal[nOutDim];
    NaReal	*pOut = new NaReal[nOutDim];
    NaReal	*pErr = new NaReal[nInpDim];

    /* Let's start the forward-backward propagation */
    int	iEpoch = 0, iLayer, j;

    if(dfDataIn->GoStartRecord() && dfTargetOut->GoStartRecord()) {
	int	nRecords = 0;

	do{
	    /* Read the learning pair */
	    for(j = 0; j < nInpDim; ++j)
		pIn[j] = dfDataIn->GetValue(j);
	    for(j = 0; j < nOutDim; ++j)
		pTar[j] = dfTargetOut->GetValue(j);

	    for(j = 0; j < nInpDim; ++j)
		pErr[j] = 0.0;

	    ++nRecords;

	    /* Pass through the net in forward direction */
	    nnu.Function(pIn, pOut);

	    /* Pass through the net in backward direction */
	    for(iLayer = nnu.OutputLayer(); iLayer >= 0; --iLayer)
		{
		    if(nnu.OutputLayer() == iLayer)
			/* Output layer */
			bpe.DeltaRule(pTar);
		    else
			/* Hidden layer */
			bpe.DeltaRule(iLayer, iLayer + 1);
		}

	    /* Compute error on input */
	    for(j = 0; j < nInpDim; ++j){
		// Or may be += ???  I didn't recognize the difference...
		pErr[j] -= bpe.PartOfDeltaRule(0, j);
	    }

	    write_output(dfDataOut, nOutDim, pOut);
	    write_output(dfErrOnIn, nInpDim, pErr);

	    /* Display epoch number, learning and testing errors */
	    printf("%d records done\r", nRecords);

	}while(!bTerminate
	       && dfDataIn->GoNextRecord()
	       && dfTargetOut->GoNextRecord());
    }

    putchar('\n');

    delete dfErrOnIn;
    delete dfDataOut;
    delete dfTargetOut;
    delete dfDataIn;
  }
  catch(NaException& ex){
    NaPrintLog("EXCEPTION: %s\n", NaExceptionMsg(ex));
  }
}